

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref * __thiscall cashew::Value::operator[](Value *this,IString x)

{
  bool bVar1;
  mapped_type *pmVar2;
  Value *this_local;
  IString x_local;
  
  x_local.str._M_len = (size_t)x.str._M_str;
  this_local = (Value *)x.str._M_len;
  bVar1 = isObject(this);
  if (!bVar1) {
    __assert_fail("isObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x1fb,"Ref &cashew::Value::operator[](IString)");
  }
  pmVar2 = std::
           unordered_map<wasm::IString,_cashew::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>_>
           ::operator[]((unordered_map<wasm::IString,_cashew::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_cashew::Ref>_>_>
                         *)(this->field_1).arr,(key_type *)&this_local);
  return pmVar2;
}

Assistant:

Ref& operator[](IString x) {
    assert(isObject());
    return (*obj)[x];
  }